

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O3

size_t __thiscall wasm::anon_unknown_0::RecGroupHasher::hash(RecGroupHasher *this,Type type)

{
  uintptr_t *puVar1;
  ulong uVar2;
  HeapType type_00;
  size_t sVar3;
  const_iterator __end2;
  const_iterator __begin2;
  uintptr_t *puVar4;
  Type local_40;
  Type type_local;
  
  type_local.id = (uintptr_t)(type.id < 7);
  if (type.id < 7) {
    uVar2 = type.id + 0x9e3779b97f4a8c15;
  }
  else {
    uVar2 = (ulong)((uint)type.id & 1);
    type_local.id = uVar2 + 0x9e3779b97f4a7c15 ^ type_local.id;
    local_40.id = type.id;
    if (uVar2 == 0) {
      uVar2 = ((ulong)((uint)type.id >> 1 & 1) | 0xa81af155173f23d6) + type_local.id * 0x1000 ^
              type_local.id;
      type_00 = wasm::Type::getHeapType(&local_40);
      sVar3 = hash(this,type_00);
      return (uVar2 >> 4) + sVar3 + uVar2 * 0x1000 + -0x61c8864680b583eb ^ uVar2;
    }
    puVar4 = *(uintptr_t **)(type.id & 0xfffffffffffffffe);
    puVar1 = (uintptr_t *)((long *)(type.id & 0xfffffffffffffffe))[1];
    uVar2 = (long)puVar1 - (long)puVar4 >> 3;
    for (; puVar1 != puVar4; puVar4 = puVar4 + 1) {
      sVar3 = hash(this,(Type)*puVar4);
      uVar2 = uVar2 ^ uVar2 * 0x1000 + -0x61c8864680b583eb + (uVar2 >> 4) + sVar3;
    }
    uVar2 = type_local.id * 0x1000 + -0x57e50eaae8c0dc2a + uVar2;
  }
  return uVar2 ^ type_local.id;
}

Assistant:

size_t hash(Type type) {
    size_t digest = wasm::hash(type.isBasic());
    if (type.isBasic()) {
      wasm::rehash(digest, type.getBasic());
      return digest;
    }
    wasm::rehash(digest, type.isTuple());
    if (type.isTuple()) {
      hash_combine(digest, hash(type.getTuple()));
      return digest;
    }
    assert(type.isRef());
    wasm::rehash(digest, type.isNullable());
    hash_combine(digest, hash(type.getHeapType()));
    return digest;
  }